

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_cad_data(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  __off_t _Var6;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  size_t end_of_string;
  REF_BOOL verbose;
  REF_INT cad_data_keyword;
  REF_FILEPOS key_pos [156];
  long local_50;
  REF_FILEPOS next_position;
  undefined4 local_40;
  REF_BOOL available;
  REF_INT dim;
  REF_INT version;
  FILE *file;
  REF_GEOM ref_geom;
  REF_MPI ref_mpi;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->mpi;
  file = (FILE *)ref_grid->geom;
  available = -1;
  local_40 = 0xffffffff;
  ref_mpi = (REF_MPI)filename;
  filename_local = (char *)ref_grid;
  sVar3 = strlen(filename);
  iVar1 = strcmp((char *)((long)ref_mpi + (sVar3 - 6)),".meshb");
  if (iVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x35f,
           "ref_part_cad_data",3,"expected .meshb extension");
    return 3;
  }
  _dim = (FILE *)0x0;
  if (ref_geom->max == 0) {
    uVar2 = ref_import_meshb_header((char *)ref_mpi,&available,(REF_FILEPOS *)&verbose);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x363,
             "ref_part_cad_data",(ulong)uVar2,"header");
      return uVar2;
    }
    _dim = fopen((char *)ref_mpi,"r");
    if (_dim == (FILE *)0x0) {
      printf("unable to open %s\n",ref_mpi);
    }
    if (_dim == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x368,
             "ref_part_cad_data","unable to open file");
      return 2;
    }
    uVar2 = ref_import_meshb_jump
                      ((FILE *)_dim,available,(REF_FILEPOS *)&verbose,3,
                       (REF_BOOL *)((long)&next_position + 4),&local_50);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x36b,
             "ref_part_cad_data",(ulong)uVar2,"jump");
      return uVar2;
    }
    if (next_position._4_4_ == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x36c,
             "ref_part_cad_data","meshb missing dimension");
      return 1;
    }
    sVar3 = fread(&local_40,4,1,_dim);
    if (sVar3 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x36d,
             "ref_part_cad_data","dim",1,sVar3);
      return 1;
    }
  }
  if (*(int *)(*(long *)filename_local + 4) == 0) {
    uVar2 = ref_import_meshb_jump
                      ((FILE *)_dim,available,(REF_FILEPOS *)&verbose,0x7e,
                       (REF_BOOL *)((long)&next_position + 4),&local_50);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x375,
             "ref_part_cad_data",(ulong)uVar2,"jump");
      return uVar2;
    }
    if (next_position._4_4_ != 0) {
      uVar2 = ref_part_meshb_size((FILE *)_dim,available,(REF_SIZE *)(file->_unused2 + 4));
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x379,"ref_part_cad_data",(ulong)uVar2,"cad data size");
        return uVar2;
      }
      if (*(long *)(file->_unused2 + 0xc) != 0) {
        free(*(void **)(file->_unused2 + 0xc));
      }
      pvVar4 = malloc(*(size_t *)(file->_unused2 + 4));
      *(void **)(file->_unused2 + 0xc) = pvVar4;
      if (*(long *)(file->_unused2 + 0xc) == 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x37f,"ref_part_cad_data","malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL");
        return 2;
      }
      sVar3 = *(size_t *)(file->_unused2 + 4);
      sVar5 = fread(*(void **)(file->_unused2 + 0xc),1,*(size_t *)(file->_unused2 + 4),_dim);
      if (sVar3 != sVar5) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",899,
               "ref_part_cad_data","cad_data",sVar3,sVar5);
        return 1;
      }
      _Var6 = ftello(_dim);
      if (local_50 != _Var6) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",900,
               "ref_part_cad_data","end location",local_50,_Var6);
        return 1;
      }
    }
  }
  uVar2 = ref_mpi_bcast((REF_MPI)ref_geom,(void *)((long)&next_position + 4),1,1);
  if (uVar2 == 0) {
    if (next_position._4_4_ == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x389,
             "ref_part_cad_data","GmfByteFlow keyword for cad data missing");
      ref_grid_local._4_4_ = 1;
    }
    else {
      if (next_position._4_4_ != 0) {
        uVar2 = ref_mpi_bcast((REF_MPI)ref_geom,file->_unused2 + 4,1,1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x38e,"ref_part_cad_data",(ulong)uVar2,"bcast");
          return uVar2;
        }
        if (*(int *)(*(long *)filename_local + 4) != 0) {
          if (*(long *)(file->_unused2 + 0xc) != 0) {
            free(*(void **)(file->_unused2 + 0xc));
          }
          pvVar4 = malloc(*(size_t *)(file->_unused2 + 4));
          *(void **)(file->_unused2 + 0xc) = pvVar4;
          if (*(long *)(file->_unused2 + 0xc) == 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x393,"ref_part_cad_data","malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL");
            return 2;
          }
        }
        uVar2 = ref_mpi_bcast((REF_MPI)ref_geom,*(void **)(file->_unused2 + 0xc),
                              (REF_INT)*(undefined8 *)(file->_unused2 + 4),4);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x397,"ref_part_cad_data",(ulong)uVar2,"bcast");
          return uVar2;
        }
      }
      if (*(int *)(*(long *)filename_local + 4) == 0) {
        fclose(_dim);
      }
      ref_grid_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x387,
           "ref_part_cad_data",(ulong)uVar2,"bcast");
    ref_grid_local._4_4_ = uVar2;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_data(REF_GRID ref_grid, const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT version = REF_EMPTY, dim = REF_EMPTY;
  REF_BOOL available;
  REF_FILEPOS next_position;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT cad_data_keyword;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }

  if (ref_grid_once(ref_grid)) {
    cad_data_keyword = 126; /* GmfByteFlow */
    RSS(ref_import_meshb_jump(file, version, key_pos, cad_data_keyword,
                              &available, &next_position),
        "jump");
    if (available) {
      RSS(ref_part_meshb_size(file, version,
                              &(ref_geom_cad_data_size(ref_geom))),
          "cad data size");
      if (verbose)
        printf("cad_data_size %ld\n", (long)ref_geom_cad_data_size(ref_geom));
      /* safe non-NULL free, if already allocated, to prevent mem leaks */
      ref_free(ref_geom_cad_data(ref_geom));
      ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                        ref_geom_cad_data_size(ref_geom), REF_BYTE);
      REIS(ref_geom_cad_data_size(ref_geom),
           fread(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
                 (size_t)ref_geom_cad_data_size(ref_geom), file),
           "cad_data");
      REIS(next_position, ftello(file), "end location");
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");

  RAS(available, "GmfByteFlow keyword for cad data missing");

  if (available) {
    RSS(ref_mpi_bcast(ref_mpi, &ref_geom_cad_data_size(ref_geom), 1,
                      REF_INT_TYPE),
        "bcast");
    if (!ref_grid_once(ref_grid)) {
      /* safe non-NULL free, if already allocated, to prevent mem leaks */
      ref_free(ref_geom_cad_data(ref_geom));
      ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                        ref_geom_cad_data_size(ref_geom), REF_BYTE);
    }
    RSS(ref_mpi_bcast(ref_mpi, ref_geom_cad_data(ref_geom),
                      (REF_INT)ref_geom_cad_data_size(ref_geom), REF_BYTE_TYPE),
        "bcast");
  }

  if (ref_grid_once(ref_grid)) {
    fclose(file);
  }

  return REF_SUCCESS;
}